

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime.cpp
# Opt level: O0

int is_prime(int x)

{
  double dVar1;
  int local_14;
  int i;
  int x_local;
  
  if (x < 2) {
    i = -1;
  }
  else if (x < 4) {
    i = 1;
  }
  else if (x % 2 == 0) {
    i = 0;
  }
  else {
    local_14 = 3;
    while( true ) {
      dVar1 = sqrt((double)x);
      dVar1 = floor(dVar1);
      if (dVar1 < (double)local_14) break;
      if (x % local_14 == 0) {
        return 0;
      }
      local_14 = local_14 + 2;
    }
    i = 1;
  }
  return i;
}

Assistant:

int is_prime(const int x) {
    if (x < 2) {
        return -1;
    }

    if (x < 4) {
        return 1;
    }

    if (x % 2 == 0) {
        return 0;
    }

    for (int i = 3; i <= floor(sqrt((double) x)); i += 2) {
        if ((x % i) == 0) {
            return 0;
        }
    }

    return 1;
}